

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heavylight2.cpp
# Opt level: O1

int dfs_numbering(int v,int t)

{
  int *piVar1;
  int t_00;
  int *piVar2;
  int local_24 [2];
  int v_local;
  
  t_00 = t + 1;
  in.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[v] =
       t_00;
  local_24[0] = v;
  if (et.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish ==
      et.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&et,
               (iterator)
               et.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish,local_24);
  }
  else {
    *et.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish = v;
    et.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         et.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         + 1;
  }
  piVar1 = G.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[local_24[0]].
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  for (piVar2 = G.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_24[0]].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
    t_00 = dfs_numbering(*piVar2,t_00);
  }
  out.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [local_24[0]] = t_00;
  return t_00;
}

Assistant:

int dfs_numbering(int v = 0, int t = -1) {
	in[v] = ++t, et.push_back(v);
	for (auto s: G[v])
		t = dfs_numbering(s, t);
	return out[v] = t;
}